

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O2

bool __thiscall zmq::zmtp_engine_t::handshake_v3_x(zmtp_engine_t *this,bool downgrade_sub_)

{
  options_t *options_;
  socket_base_t *this_00;
  int iVar1;
  plain_server_t *this_01;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  plain_client_t *this_02;
  undefined8 uVar2;
  
  options_ = &(this->super_stream_engine_base_t)._options;
  iVar1 = (this->super_stream_engine_base_t)._options.mechanism;
  if (iVar1 == 1) {
    iVar1 = bcmp(this->_greeting_recv + 0xc,"PLAIN",0x14);
    if (iVar1 != 0) goto LAB_001ce2d2;
    if ((this->super_stream_engine_base_t)._options.as_server == 0) {
      this_02 = (plain_client_t *)operator_new(0x5a0,(nothrow_t *)&std::nothrow);
      if (this_02 != (plain_client_t *)0x0) {
        plain_client_t::plain_client_t(this_02,(this->super_stream_engine_base_t)._session,options_)
        ;
        goto LAB_001ce346;
      }
    }
    else {
      this_01 = (plain_server_t *)operator_new(0x5e8,(nothrow_t *)&std::nothrow);
      if (this_01 != (plain_server_t *)0x0) {
        plain_server_t::plain_server_t
                  (this_01,(this->super_stream_engine_base_t)._session,
                   &(this->super_stream_engine_base_t)._peer_address,options_);
        goto LAB_001ce342;
      }
      this_02 = (plain_client_t *)0x0;
    }
    (this->super_stream_engine_base_t)._mechanism = (mechanism_t *)this_02;
    uVar2 = 0x16c;
  }
  else {
    if ((iVar1 != 0) || (iVar1 = bcmp(this->_greeting_recv + 0xc,"NULL",0x14), iVar1 != 0)) {
LAB_001ce2d2:
      this_00 = (this->super_stream_engine_base_t)._socket;
      endpoint_uri_pair_ = session_base_t::get_endpoint((this->super_stream_engine_base_t)._session)
      ;
      socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x11000002);
      stream_engine_base_t::error(&this->super_stream_engine_base_t,protocol_error);
      return false;
    }
    this_01 = (plain_server_t *)operator_new(0x5e8,(nothrow_t *)&std::nothrow);
    if (this_01 != (plain_server_t *)0x0) {
      null_mechanism_t::null_mechanism_t
                ((null_mechanism_t *)this_01,(this->super_stream_engine_base_t)._session,
                 &(this->super_stream_engine_base_t)._peer_address,options_);
LAB_001ce342:
      this_02 = (plain_client_t *)
                &(this_01->super_zap_client_common_handshake_t).super_zap_client_t.field_0x50;
LAB_001ce346:
      (this->super_stream_engine_base_t)._mechanism = (mechanism_t *)this_02;
      goto LAB_001ce34d;
    }
    (this->super_stream_engine_base_t)._mechanism = (mechanism_t *)0x0;
    uVar2 = 0x161;
  }
  fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
          ,uVar2);
  fflush(_stderr);
  zmq_abort("FATAL ERROR: OUT OF MEMORY");
LAB_001ce34d:
  (this->super_stream_engine_base_t)._next_msg =
       (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::next_handshake_command;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x550 = 0;
  (this->super_stream_engine_base_t)._process_msg =
       (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::process_handshake_command;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x560 = 0;
  return true;
}

Assistant:

bool zmq::zmtp_engine_t::handshake_v3_x (const bool downgrade_sub_)
{
    if (_options.mechanism == ZMQ_NULL
        && memcmp (_greeting_recv + 12, "NULL\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0",
                   20)
             == 0) {
        _mechanism = new (std::nothrow)
          null_mechanism_t (session (), _peer_address, _options);
        alloc_assert (_mechanism);
    } else if (_options.mechanism == ZMQ_PLAIN
               && memcmp (_greeting_recv + 12,
                          "PLAIN\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                    == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow)
              plain_server_t (session (), _peer_address, _options);
        else
            _mechanism =
              new (std::nothrow) plain_client_t (session (), _options);
        alloc_assert (_mechanism);
    }
#ifdef ZMQ_HAVE_CURVE
    else if (_options.mechanism == ZMQ_CURVE
             && memcmp (_greeting_recv + 12,
                        "CURVE\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                  == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow) curve_server_t (
              session (), _peer_address, _options, downgrade_sub_);
        else
            _mechanism = new (std::nothrow)
              curve_client_t (session (), _options, downgrade_sub_);
        alloc_assert (_mechanism);
    }
#endif
#ifdef HAVE_LIBGSSAPI_KRB5
    else if (_options.mechanism == ZMQ_GSSAPI
             && memcmp (_greeting_recv + 12,
                        "GSSAPI\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 20)
                  == 0) {
        if (_options.as_server)
            _mechanism = new (std::nothrow)
              gssapi_server_t (session (), _peer_address, _options);
        else
            _mechanism =
              new (std::nothrow) gssapi_client_t (session (), _options);
        alloc_assert (_mechanism);
    }
#endif
    else {
        socket ()->event_handshake_failed_protocol (
          session ()->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MECHANISM_MISMATCH);
        error (protocol_error);
        return false;
    }